

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bool fmt::v8::detail::dragonbox::is_center_integer<double>
               (carrier_uint two_f,int exponent,int minus_k)

{
  bool bVar1;
  
  if (exponent < 0x57) {
    if (9 < exponent) {
      bVar1 = divisible_by_power_of_5(two_f,minus_k);
      return bVar1;
    }
    bVar1 = true;
    if (exponent < -4) {
      bVar1 = divisible_by_power_of_2(two_f,(minus_k - exponent) + 1);
      return bVar1;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool is_center_integer(typename float_info<T>::carrier_uint two_f, int exponent,
                       int minus_k) FMT_NOEXCEPT {
  // Exponent for 5 is negative.
  if (exponent > float_info<T>::divisibility_check_by_5_threshold) return false;
  if (exponent > float_info<T>::case_fc_upper_threshold)
    return divisible_by_power_of_5(two_f, minus_k);
  // Both exponents are nonnegative.
  if (exponent >= float_info<T>::case_fc_lower_threshold) return true;
  // Exponent for 2 is negative.
  return divisible_by_power_of_2(two_f, minus_k - exponent + 1);
}